

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

int Bac_ManObjNum(Bac_Man_t *p)

{
  int iVar1;
  Bac_Ntk_t *p_00;
  undefined4 local_20;
  undefined4 local_1c;
  int Count;
  int i;
  Bac_Ntk_t *pNtk;
  Bac_Man_t *p_local;
  
  local_20 = 0;
  for (local_1c = 1; iVar1 = Bac_ManNtkNum(p), local_1c <= iVar1; local_1c = local_1c + 1) {
    p_00 = Bac_ManNtk(p,local_1c);
    iVar1 = Bac_NtkObjNum(p_00);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

static inline int Bac_ManObjNum( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i, Count = 0;
    Bac_ManForEachNtk( p, pNtk, i )
        Count += Bac_NtkObjNum(pNtk);
    return Count;
}